

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::MultisampleCase::readImage(MultisampleCase *this,Surface *dst)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  GLenum GVar4;
  void *pvVar5;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  if ((this->m_fboParams).useFbo == true) {
    glwBindFramebuffer(0x8ca9,this->m_resolveFbo);
    GVar4 = glwGetError();
    glu::checkError(GVar4,"glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x196);
    glwBlitFramebuffer(0,0,this->m_renderWidth,this->m_renderHeight,0,0,this->m_renderWidth,
                       this->m_renderHeight,0x4000,0x2600);
    GVar4 = glwGetError();
    glu::checkError(GVar4,
                    "glBlitFramebuffer(0, 0, m_renderWidth, m_renderHeight, 0, 0, m_renderWidth, m_renderHeight, GL_COLOR_BUFFER_BIT, GL_NEAREST)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x197);
    glwBindFramebuffer(0x8ca8,this->m_resolveFbo);
    GVar4 = glwGetError();
    glu::checkError(GVar4,"glBindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x198);
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    iVar1 = this->m_viewportX;
    iVar2 = this->m_viewportY;
    local_60.order = RGBA;
    local_60.type = UNORM_INT8;
    pvVar5 = (void *)(dst->m_pixels).m_cap;
    if (pvVar5 != (void *)0x0) {
      pvVar5 = (dst->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_60,dst->m_width,dst->m_height,1,pvVar5);
    glu::readPixels(pRVar3,iVar1,iVar2,&local_58);
    glwBindFramebuffer(0x8d40,this->m_msFbo);
    GVar4 = glwGetError();
    glu::checkError(GVar4,"glBindFramebuffer(GL_FRAMEBUFFER, m_msFbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x19c);
  }
  else {
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    iVar1 = this->m_viewportX;
    iVar2 = this->m_viewportY;
    local_60.order = RGBA;
    local_60.type = UNORM_INT8;
    pvVar5 = (void *)(dst->m_pixels).m_cap;
    if (pvVar5 != (void *)0x0) {
      pvVar5 = (dst->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_60,dst->m_width,dst->m_height,1,pvVar5);
    glu::readPixels(pRVar3,iVar1,iVar2,&local_58);
  }
  return;
}

Assistant:

void MultisampleCase::readImage (tcu::Surface& dst) const
{
	if (m_fboParams.useFbo)
	{
		GLU_CHECK_CALL(glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo));
		GLU_CHECK_CALL(glBlitFramebuffer(0, 0, m_renderWidth, m_renderHeight, 0, 0, m_renderWidth, m_renderHeight, GL_COLOR_BUFFER_BIT, GL_NEAREST));
		GLU_CHECK_CALL(glBindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo));

		glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());

		GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, m_msFbo));
	}
	else
		glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());
}